

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTendonAnchor::~IfcTendonAnchor(IfcTendonAnchor *this)

{
  ~IfcTendonAnchor(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

IfcTendonAnchor() : Object("IfcTendonAnchor") {}